

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserMetadata.cpp
# Opt level: O2

void __thiscall
slang::parsing::anon_unknown_4::MetadataVisitor::handle
          (MetadataVisitor *this,ModuleDeclarationSyntax *syntax)

{
  group_type_pointer pgVar1;
  group_type_pointer pgVar2;
  undefined4 uVar3;
  pointer puVar4;
  size_type sVar5;
  group_type_pointer pgVar6;
  value_type_pointer pbVar7;
  value_type_pointer ppVar8;
  int iVar9;
  uint uVar10;
  undefined1 auVar11 [16];
  bool bVar12;
  uint uVar13;
  uint64_t hash;
  size_t sVar14;
  SyntaxNode *pSVar15;
  byte bVar16;
  ulong uVar17;
  ulong uVar18;
  ulong uVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  pointer puVar23;
  hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *this_00;
  uchar uVar24;
  uchar uVar26;
  uchar uVar27;
  byte bVar28;
  undefined1 auVar25 [16];
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  byte bVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  byte bVar37;
  uchar uVar38;
  uchar uVar39;
  uchar uVar40;
  byte bVar41;
  undefined1 auVar29 [16];
  Token token;
  string_view name;
  try_emplace_args_t local_d1;
  _Storage<slang::TimeScale,_true> local_d0;
  bool local_cc;
  string_view local_c8;
  pointer local_b8;
  undefined8 uStack_b0;
  ulong local_a8;
  uint64_t local_a0;
  ulong local_98;
  ulong local_90;
  ulong local_88;
  locator local_80;
  uchar local_68;
  uchar uStack_67;
  uchar uStack_66;
  byte bStack_65;
  uchar uStack_64;
  uchar uStack_63;
  uchar uStack_62;
  byte bStack_61;
  uchar uStack_60;
  uchar uStack_5f;
  uchar uStack_5e;
  byte bStack_5d;
  uchar uStack_5c;
  uchar uStack_5b;
  uchar uStack_5a;
  byte bStack_59;
  uchar local_58;
  uchar uStack_57;
  uchar uStack_56;
  byte bStack_55;
  uchar uStack_54;
  uchar uStack_53;
  uchar uStack_52;
  byte bStack_51;
  uchar uStack_50;
  uchar uStack_4f;
  uchar uStack_4e;
  byte bStack_4d;
  uchar uStack_4c;
  uchar uStack_4b;
  uchar uStack_4a;
  byte bStack_49;
  uchar local_48;
  uchar uStack_47;
  uchar uStack_46;
  byte bStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  byte bStack_41;
  uchar uStack_40;
  uchar uStack_3f;
  uchar uStack_3e;
  byte bStack_3d;
  uchar uStack_3c;
  uchar uStack_3b;
  uchar uStack_3a;
  byte bStack_39;
  
  pSVar15 = (syntax->super_MemberSyntax).super_SyntaxNode.parent;
  if ((pSVar15 != (SyntaxNode *)0x0) && (pSVar15->kind != CompilationUnit)) {
    local_c8 = Token::valueText(&((syntax->header).ptr)->name);
    puVar4 = (this->moduleDeclStack).
             super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
             .data_;
    sVar5 = (this->moduleDeclStack).
            super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            .len;
    puVar23 = puVar4 + sVar5;
    this_00 = (hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
              (puVar4 + (sVar5 - 1));
    hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                     (this_00,&local_c8);
    uVar17 = hash >> ((byte)*this_00 & 0x3f);
    lVar20 = (hash & 0xff) * 4;
    uVar24 = (&UNK_004a00ac)[lVar20];
    uVar26 = (&UNK_004a00ad)[lVar20];
    uVar27 = (&UNK_004a00ae)[lVar20];
    bVar28 = (&UNK_004a00af)[lVar20];
    uVar19 = (ulong)((uint)hash & 7);
    uVar18 = 0;
    uVar21 = uVar17;
    uVar30 = uVar24;
    uVar31 = uVar26;
    uVar32 = uVar27;
    bVar33 = bVar28;
    uVar34 = uVar24;
    uVar35 = uVar26;
    uVar36 = uVar27;
    bVar37 = bVar28;
    uVar38 = uVar24;
    uVar39 = uVar26;
    uVar40 = uVar27;
    bVar41 = bVar28;
    do {
      pgVar6 = puVar23[-1].table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_;
      pgVar1 = pgVar6 + uVar21;
      local_48 = pgVar1->m[0].n;
      uStack_47 = pgVar1->m[1].n;
      uStack_46 = pgVar1->m[2].n;
      bStack_45 = pgVar1->m[3].n;
      uStack_44 = pgVar1->m[4].n;
      uStack_43 = pgVar1->m[5].n;
      uStack_42 = pgVar1->m[6].n;
      bStack_41 = pgVar1->m[7].n;
      uStack_40 = pgVar1->m[8].n;
      uStack_3f = pgVar1->m[9].n;
      uStack_3e = pgVar1->m[10].n;
      bStack_3d = pgVar1->m[0xb].n;
      uStack_3c = pgVar1->m[0xc].n;
      uStack_3b = pgVar1->m[0xd].n;
      uStack_3a = pgVar1->m[0xe].n;
      bVar16 = pgVar1->m[0xf].n;
      auVar25[0] = -(local_48 == uVar24);
      auVar25[1] = -(uStack_47 == uVar26);
      auVar25[2] = -(uStack_46 == uVar27);
      auVar25[3] = -(bStack_45 == bVar28);
      auVar25[4] = -(uStack_44 == uVar30);
      auVar25[5] = -(uStack_43 == uVar31);
      auVar25[6] = -(uStack_42 == uVar32);
      auVar25[7] = -(bStack_41 == bVar33);
      auVar25[8] = -(uStack_40 == uVar34);
      auVar25[9] = -(uStack_3f == uVar35);
      auVar25[10] = -(uStack_3e == uVar36);
      auVar25[0xb] = -(bStack_3d == bVar37);
      auVar25[0xc] = -(uStack_3c == uVar38);
      auVar25[0xd] = -(uStack_3b == uVar39);
      auVar25[0xe] = -(uStack_3a == uVar40);
      auVar25[0xf] = -(bVar16 == bVar41);
      uVar13 = (uint)(ushort)((ushort)(SUB161(auVar25 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar25 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB161(auVar25 >> 0x17,0) & 1) << 2 |
                              (ushort)(SUB161(auVar25 >> 0x1f,0) & 1) << 3 |
                              (ushort)(SUB161(auVar25 >> 0x27,0) & 1) << 4 |
                              (ushort)(SUB161(auVar25 >> 0x2f,0) & 1) << 5 |
                              (ushort)(SUB161(auVar25 >> 0x37,0) & 1) << 6 |
                              (ushort)(SUB161(auVar25 >> 0x3f,0) & 1) << 7 |
                              (ushort)(SUB161(auVar25 >> 0x47,0) & 1) << 8 |
                              (ushort)(SUB161(auVar25 >> 0x4f,0) & 1) << 9 |
                              (ushort)(SUB161(auVar25 >> 0x57,0) & 1) << 10 |
                              (ushort)(SUB161(auVar25 >> 0x5f,0) & 1) << 0xb |
                              (ushort)(SUB161(auVar25 >> 0x67,0) & 1) << 0xc |
                              (ushort)(SUB161(auVar25 >> 0x6f,0) & 1) << 0xd |
                             (ushort)(SUB161(auVar25 >> 0x77,0) & 1) << 0xe);
      bStack_39 = bVar16;
      if (uVar13 != 0) {
        pbVar7 = puVar23[-1].table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
                 .arrays.elements_;
        local_b8 = puVar23;
        local_a8 = uVar17;
        local_a0 = hash;
        local_98 = uVar21;
        local_90 = uVar18;
        local_88 = uVar19;
        local_68 = uVar24;
        uStack_67 = uVar26;
        uStack_66 = uVar27;
        bStack_65 = bVar28;
        uStack_64 = uVar30;
        uStack_63 = uVar31;
        uStack_62 = uVar32;
        bStack_61 = bVar33;
        uStack_60 = uVar34;
        uStack_5f = uVar35;
        uStack_5e = uVar36;
        bStack_5d = bVar37;
        uStack_5c = uVar38;
        uStack_5b = uVar39;
        uStack_5a = uVar40;
        bStack_59 = bVar41;
        do {
          iVar9 = 0;
          if (uVar13 != 0) {
            for (; (uVar13 >> iVar9 & 1) == 0; iVar9 = iVar9 + 1) {
            }
          }
          bVar12 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                             ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                              this_00,&local_c8,
                              (basic_string_view<char,_std::char_traits<char>_> *)
                              ((long)&pbVar7[uVar21 * 0xf]._M_len + (ulong)(uint)(iVar9 << 4)));
          if (bVar12) goto LAB_003f88e7;
          uVar13 = uVar13 - 1 & uVar13;
        } while (uVar13 != 0);
        bVar16 = pgVar6[uVar21].m[0xf].n;
        hash = local_a0;
        uVar17 = local_a8;
        uVar18 = local_90;
        uVar21 = local_98;
        uVar19 = local_88;
        puVar23 = local_b8;
        uVar24 = local_68;
        uVar26 = uStack_67;
        uVar27 = uStack_66;
        bVar28 = bStack_65;
        uVar30 = uStack_64;
        uVar31 = uStack_63;
        uVar32 = uStack_62;
        bVar33 = bStack_61;
        uVar34 = uStack_60;
        uVar35 = uStack_5f;
        uVar36 = uStack_5e;
        bVar37 = bStack_5d;
        uVar38 = uStack_5c;
        uVar39 = uStack_5b;
        uVar40 = uStack_5a;
        bVar41 = bStack_59;
      }
      if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
             is_not_overflowed(unsigned_long)::shift)[uVar19] & bVar16) == 0) break;
      uVar22 = puVar23[-1].table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
               .arrays.groups_size_mask;
      lVar20 = uVar21 + uVar18;
      uVar18 = uVar18 + 1;
      uVar21 = lVar20 + 1U & uVar22;
    } while (uVar18 <= uVar22);
    if (puVar23[-1].table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.size <
        puVar23[-1].table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char>_>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::basic_string_view<char>_>_>
        .size_ctrl.ml) {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_at<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)&local_80,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)this_00,uVar17,hash,&local_c8);
    }
    else {
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
      ::unchecked_emplace_with_rehash<std::basic_string_view<char,std::char_traits<char>>&>
                ((locator *)&local_80,
                 (table_core<boost::unordered::detail::foa::flat_set_types<std::basic_string_view<char,std::char_traits<char>>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::basic_string_view<char,std::char_traits<char>>>>
                  *)this_00,hash,&local_c8);
    }
  }
LAB_003f88e7:
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::emplace_back<>(&(this->moduleDeclStack).
                    super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  );
  uVar13 = 0;
  while( true ) {
    uVar17 = (ulong)uVar13;
    sVar14 = slang::syntax::SyntaxNode::getChildCount((SyntaxNode *)syntax);
    if (sVar14 <= uVar17) break;
    pSVar15 = slang::syntax::SyntaxNode::childNode((SyntaxNode *)syntax,uVar17);
    if (pSVar15 == (SyntaxNode *)0x0) {
      token = slang::syntax::SyntaxNode::childToken((SyntaxNode *)syntax,uVar17);
      if (token.info != (Info *)0x0) {
        visitToken(this,token);
      }
    }
    else {
      slang::syntax::detail::
      visitSyntaxNode<slang::syntax::SyntaxNode_const,slang::parsing::(anonymous_namespace)::MetadataVisitor>
                (pSVar15,this);
    }
    uVar13 = uVar13 + 1;
  }
  SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  ::pop_back(&(this->moduleDeclStack).
              super_SmallVectorBase<boost::unordered::unordered_flat_set<std::basic_string_view<char,_std::char_traits<char>_>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
            );
  local_b8 = *(pointer *)&this->defaultNetType;
  bVar12 = this->cellDefine;
  local_cc = (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>._M_engaged;
  local_d0 = (this->timeScale).super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
             super__Optional_payload_base<slang::TimeScale>._M_payload;
  local_c8._M_len = (size_t)syntax;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = syntax;
  uVar22 = SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),8) ^
           SUB168(auVar11 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar21 = uVar22 >> ((byte)(this->meta).nodeMap.table_.
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
                            .arrays.groups_size_index & 0x3f);
  uVar3 = (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
            match_word(unsigned_long)::word)[uVar22 & 0xff];
  ppVar8 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.elements_;
  uVar17 = (this->meta).nodeMap.table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
           .arrays.groups_size_mask;
  uVar19 = 0;
  uVar18 = uVar21;
  do {
    pgVar2 = (this->meta).nodeMap.table_.
             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
             .arrays.groups_ + uVar18;
    local_58 = pgVar2->m[0].n;
    uStack_57 = pgVar2->m[1].n;
    uStack_56 = pgVar2->m[2].n;
    bStack_55 = pgVar2->m[3].n;
    uStack_54 = pgVar2->m[4].n;
    uStack_53 = pgVar2->m[5].n;
    uStack_52 = pgVar2->m[6].n;
    bStack_51 = pgVar2->m[7].n;
    uStack_50 = pgVar2->m[8].n;
    uStack_4f = pgVar2->m[9].n;
    uStack_4e = pgVar2->m[10].n;
    bStack_4d = pgVar2->m[0xb].n;
    uStack_4c = pgVar2->m[0xc].n;
    uStack_4b = pgVar2->m[0xd].n;
    uStack_4a = pgVar2->m[0xe].n;
    bStack_49 = pgVar2->m[0xf].n;
    uVar24 = (uchar)uVar3;
    auVar29[0] = -(local_58 == uVar24);
    uVar26 = (uchar)((uint)uVar3 >> 8);
    auVar29[1] = -(uStack_57 == uVar26);
    uVar27 = (uchar)((uint)uVar3 >> 0x10);
    auVar29[2] = -(uStack_56 == uVar27);
    bVar28 = (byte)((uint)uVar3 >> 0x18);
    auVar29[3] = -(bStack_55 == bVar28);
    auVar29[4] = -(uStack_54 == uVar24);
    auVar29[5] = -(uStack_53 == uVar26);
    auVar29[6] = -(uStack_52 == uVar27);
    auVar29[7] = -(bStack_51 == bVar28);
    auVar29[8] = -(uStack_50 == uVar24);
    auVar29[9] = -(uStack_4f == uVar26);
    auVar29[10] = -(uStack_4e == uVar27);
    auVar29[0xb] = -(bStack_4d == bVar28);
    auVar29[0xc] = -(uStack_4c == uVar24);
    auVar29[0xd] = -(uStack_4b == uVar26);
    auVar29[0xe] = -(uStack_4a == uVar27);
    auVar29[0xf] = -(bStack_49 == bVar28);
    for (uVar13 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                 (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                 (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                 (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                 (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                 (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                 (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                 (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                 (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                 (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                 (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                 (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                 (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                 (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe); uVar13 != 0;
        uVar13 = uVar13 - 1 & uVar13) {
      uVar10 = 0;
      if (uVar13 != 0) {
        for (; (uVar13 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
        }
      }
      if ((ModuleDeclarationSyntax *)ppVar8[uVar18 * 0xf + (ulong)uVar10].first == syntax) {
        local_80.p = ppVar8 + uVar18 * 0xf + (ulong)uVar10;
        goto LAB_003f8a77;
      }
    }
    if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
           is_not_overflowed(unsigned_long)::shift)[(uint)uVar22 & 7] & bStack_49) == 0) break;
    lVar20 = uVar18 + uVar19;
    uVar19 = uVar19 + 1;
    uVar18 = lVar20 + 1U & uVar17;
  } while (uVar19 <= uVar17);
  uStack_b0 = 0;
  if ((this->meta).nodeMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
      .size_ctrl.size <
      (this->meta).nodeMap.table_.
      super_table_core_impl<boost::unordered::detail::foa::flat_map_types<const_slang::syntax::SyntaxNode_*,_slang::parsing::ParserMetadata::Node>,_slang::hash<const_slang::syntax::SyntaxNode_*>,_std::equal_to<const_slang::syntax::SyntaxNode_*>,_std::allocator<std::pair<const_slang::syntax::SyntaxNode_*const,_slang::parsing::ParserMetadata::Node>_>_>
      .size_ctrl.ml) {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
    ::
    unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (&local_80,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                *)this,uVar21,uVar22,&local_d1,(SyntaxNode **)&local_c8);
  }
  else {
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
    ::
    unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,slang::syntax::SyntaxNode_const*>
              (&local_80,
               (table_core<boost::unordered::detail::foa::flat_map_types<slang::syntax::SyntaxNode_const*,slang::parsing::ParserMetadata::Node>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::SyntaxNode_const*,void>,std::equal_to<slang::syntax::SyntaxNode_const*>,std::allocator<std::pair<slang::syntax::SyntaxNode_const*const,slang::parsing::ParserMetadata::Node>>>
                *)this,uVar22,&local_d1,(SyntaxNode **)&local_c8);
  }
LAB_003f8a77:
  ((local_80.p)->second).defaultNetType = (short)local_b8._0_4_;
  ((local_80.p)->second).unconnectedDrive = (short)((uint)local_b8._0_4_ >> 0x10);
  ((local_80.p)->second).cellDefine = bVar12;
  ((local_80.p)->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_payload = local_d0;
  ((local_80.p)->second).timeScale.super__Optional_base<slang::TimeScale,_true,_true>._M_payload.
  super__Optional_payload_base<slang::TimeScale>._M_engaged = local_cc;
  return;
}

Assistant:

void handle(const ModuleDeclarationSyntax& syntax) {
        if (syntax.parent && syntax.parent->kind != SyntaxKind::CompilationUnit) {
            auto name = syntax.header->name.valueText();
            moduleDeclStack.back().emplace(name);
        }

        moduleDeclStack.emplace_back();
        visitDefault(syntax);
        moduleDeclStack.pop_back();

        // Needs to come after we visitDefault because visiting the first token
        // might update our preproc state.
        meta.nodeMap[&syntax] = {defaultNetType, unconnectedDrive, cellDefine, timeScale};
    }